

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CategoricalMapping::clear_ValueOnUnknown(CategoricalMapping *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  
  if (this->_oneof_case_[1] == 0x65) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Destroy
              ((ArenaStringPtr *)&this->ValueOnUnknown_,puVar2);
  }
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void CategoricalMapping::clear_ValueOnUnknown() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.CategoricalMapping)
  switch (ValueOnUnknown_case()) {
    case kStrValue: {
      ValueOnUnknown_.strvalue_.Destroy(::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::EmptyDefault{}, GetArenaForAllocation());
      break;
    }
    case kInt64Value: {
      // No need to clear
      break;
    }
    case VALUEONUNKNOWN_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = VALUEONUNKNOWN_NOT_SET;
}